

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.c
# Opt level: O1

uint main(void)

{
  int *piVar1;
  int *piVar2;
  undefined8 *__ptr;
  long lVar3;
  char *__ptr_00;
  undefined4 *__ptr_01;
  uint i;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  int *piVar7;
  uint uVar8;
  
  piVar1 = (int *)calloc(4,4);
  piVar1[0] = 4;
  piVar1[1] = 5;
  piVar1[2] = 6;
  piVar1[3] = 7;
  uVar8 = 0;
  if (*piVar1 == 4) {
    uVar4 = 0;
    do {
      uVar6 = uVar4;
      if (uVar6 == 3) break;
      uVar4 = uVar6 + 1;
    } while (piVar1[uVar6 + 1] == (&DAT_00102154)[uVar6]);
    uVar8 = (uint)(2 < uVar6);
  }
  REQUIRE(uVar8);
  free(piVar1);
  piVar1 = (int *)calloc(6,4);
  piVar2 = &DAT_001020b4;
  uVar4 = 0;
  do {
    piVar7 = (int *)(&DAT_001020c0 + (ulong)((int)uVar4 - 3) * 4);
    if (uVar4 < 3) {
      piVar7 = piVar2;
    }
    piVar1[uVar4] = *piVar7;
    uVar4 = uVar4 + 1;
    piVar2 = piVar2 + 1;
  } while (uVar4 != 6);
  uVar8 = 0;
  if (*piVar1 == 0) {
    uVar4 = 0;
    do {
      uVar6 = uVar4;
      if (uVar6 == 5) break;
      uVar4 = uVar6 + 1;
    } while ((&DAT_001020d4)[uVar6] == piVar1[uVar6 + 1]);
    uVar8 = (uint)(4 < uVar6);
  }
  REQUIRE(uVar8);
  REQUIRE(1);
  free(piVar1);
  __ptr = (undefined8 *)calloc(3,4);
  *__ptr = 0xa00000005;
  *(undefined4 *)(__ptr + 1) = 100;
  uVar4 = 0;
  do {
    uVar6 = uVar4;
    if (uVar6 == 2) break;
    uVar4 = uVar6 + 1;
  } while ((&DAT_001020ec)[uVar6] == *(int *)((long)__ptr + uVar6 * 4 + 4));
  REQUIRE((uint)(1 < uVar6));
  free(__ptr);
  piVar1 = (int *)calloc(3,4);
  lVar3 = 0;
  do {
    *(int *)((long)piVar1 + lVar3) =
         *(int *)((long)&DAT_00102100 + lVar3) + *(int *)((long)&DAT_001020f4 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  uVar8 = 0;
  if (*piVar1 == 10) {
    uVar4 = 0;
    do {
      uVar6 = uVar4;
      if (uVar6 == 2) break;
      uVar4 = uVar6 + 1;
    } while ((&DAT_00102110)[uVar6] == piVar1[uVar6 + 1]);
    uVar8 = (uint)(1 < uVar6);
  }
  REQUIRE(uVar8);
  REQUIRE(1);
  free(piVar1);
  __ptr_00 = (char *)calloc(0xc,1);
  lVar3 = 0;
  pcVar5 = __ptr_00;
  do {
    *pcVar5 = *(char *)((long)L"hello world" + lVar3);
    lVar3 = lVar3 + 4;
    pcVar5 = pcVar5 + 1;
  } while (lVar3 != 0x2c);
  uVar8 = 0;
  if (*__ptr_00 == 'h') {
    uVar4 = 0;
    do {
      uVar6 = uVar4;
      if (uVar6 == 10) break;
      uVar4 = uVar6 + 1;
    } while ("hello world"[uVar6 + 1] == __ptr_00[uVar6 + 1]);
    uVar8 = (uint)(9 < uVar6);
  }
  REQUIRE(uVar8);
  free(__ptr_00);
  REQUIRE(1);
  __ptr_01 = (undefined4 *)calloc(5,1);
  *__ptr_01 = 0x206f6c6c;
  uVar4 = 0;
  do {
    uVar6 = uVar4;
    if (uVar6 == 4) break;
    uVar4 = uVar6 + 1;
  } while ((&DAT_00102082)[uVar6] == *(char *)((long)__ptr_01 + uVar6 + 1));
  REQUIRE((uint)(3 < uVar6));
  REQUIRE(1);
  free(__ptr_01);
  REQUIRE(1);
  return total;
}

Assistant:

uint32_t main()
{
    { // submatrix test
        uint32_t a[] = {1, 2, 3, 4, 5, 6, 7, 8, 9};
        uint32_t *b = submatrix(a, 3, 7);
        uint32_t c[] = {4, 5, 6, 7};
        REQUIRE(AR_EQ(b, c, LEN(c)));
        vector_free(b);
    }

    { // stack test
        uint32_t a[] = {0, 1, 2};
        uint32_t b[] = {4, 5, 6};
        uint32_t d[] = {0, 1, 2, 4, 5, 6};
        uint32_t c_len = 0;
        uint32_t *c = stack(a, 3, b, 3, &c_len);
        REQUIRE(AR_EQ(d, c, LEN(d)));
        REQUIRE(c_len == LEN(d));
        vector_free(c);
    }

    { // vector copy test
        uint32_t a[] = {5, 10, 100};
        uint32_t len = LEN(a);
        uint32_t *b = vector_copy(a, len);
        REQUIRE(AR_EQ(a, b, len));
        vector_free(b);
    }

    { // vector sum test
        uint32_t a[] = {1, 2, 3};
        uint32_t b[] = {9, 8, 7};
        uint32_t c[] = {10, 10, 10};
        uint32_t s_len = 0;
        uint32_t *s = vector_sum(a, LEN(a), b, LEN(b), &s_len);
        REQUIRE(AR_EQ(c, s, LEN(c)));
        REQUIRE(s_len == LEN(c));
        vector_free(s);
    }

    { // vector to str test
        uint8_t *expected = "hello world";
        uint32_t v[] = {104, 101, 108, 108, 111, 32, 119, 111, 114, 108, 100};
        uint8_t *actual = vector_to_str(v, LEN(v));
        REQUIRE(STR_EQ(expected, actual, LEN(v)));
        free(actual);
    }

    { // sum test
        uint32_t a[] = {1, 2, 4, 8, 16, 32};
        REQUIRE(sum(a, LEN(a)) == 63);
    }

    { // substring test
        uint8_t s[] = "hello world";
        uint8_t expected[] = "llo ";
        uint32_t len = 0;
        uint8_t *res = substring(s, 2, 5, &len);
        REQUIRE(STR_EQ(expected, res, LEN(expected)));
        REQUIRE(len == 4);
        free(res);
    }

    { // strlength test
        uint8_t s[] = "hello world!";
        REQUIRE(strlength(s) == LEN(s) - 1);
    }

    TEST_EXIT;
}